

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RedirectedStdOut::RedirectedStdOut(RedirectedStdOut *this)

{
  ostream *originalStream;
  ostream *redirectionStream;
  RedirectedStdOut *this_local;
  
  ReusableStringStream::ReusableStringStream(&this->m_rss);
  originalStream = cout();
  redirectionStream = ReusableStringStream::get(&this->m_rss);
  RedirectedStream::RedirectedStream(&this->m_cout,originalStream,redirectionStream);
  return;
}

Assistant:

RedirectedStdOut::RedirectedStdOut() : m_cout( Catch::cout(), m_rss.get() ) {}